

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O2

Float __thiscall
pbrt::TrowbridgeReitzDistribution::PDF(TrowbridgeReitzDistribution *this,Vector3f *wo,Vector3f *wm)

{
  undefined1 auVar1 [16];
  Float FVar2;
  Float FVar3;
  float fVar4;
  
  FVar2 = D(this,wm);
  FVar3 = G1(this,wo);
  fVar4 = AbsDot<float>(wo,wm);
  auVar1._8_4_ = 0x7fffffff;
  auVar1._0_8_ = 0x7fffffff7fffffff;
  auVar1._12_4_ = 0x7fffffff;
  auVar1 = vandps_avx512vl(ZEXT416((uint)(wo->super_Tuple3<pbrt::Vector3,_float>).z),auVar1);
  return (fVar4 * FVar3 * FVar2) / auVar1._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const Vector3f &wo, const Vector3f &wm) const {
        return D(wm) * G1(wo) * AbsDot(wo, wm) / AbsCosTheta(wo);
    }